

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *cursor;
  long lVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  int64_t iVar5;
  int64_t iVar6;
  char *pcVar7;
  Type type;
  ulong uVar8;
  undefined1 auStack_208 [8];
  GroupType groupRef;
  undefined1 auStack_c8 [8];
  GroupSet groupSet;
  undefined1 local_68 [8];
  Visitor visitor;
  int local_38;
  uint local_34;
  int instances;
  int tag;
  
  cursor = context->cursor;
  visitor._24_8_ = field;
  bVar3 = match_int_fast(&local_38,cursor);
  iVar2 = local_38;
  if (bVar3) {
    bVar3 = StreamCursor::advance(cursor,1);
    if (iVar2 == 0) {
      if (bVar3) {
        return;
      }
      pcVar7 = "Got early EOF after tag %d value";
    }
    else {
      if (bVar3) {
        llvm::
        SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
        ::reserve((SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                   *)visitor._24_8_,(long)local_38);
        groupSet.bits.super__Base_bitset<7UL>._M_w[3] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[4] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[2] = 0;
        auStack_c8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[0] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[5] = 0;
LAB_00a6f67f:
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        .unparsed.
        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
        .
        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
        .super_SmallVectorBase.EndX =
             (void *)((long)groupRef.
                            super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                            .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer
                     + 0x10);
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        .allBits.super__Base_bitset<1UL>._M_w =
             (_Base_bitset<1UL>)
             ((long)&groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                     .unparsed.
                     super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                     .
                     super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                     .
                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                     .super_SmallVectorBase + 0x10);
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        .values.base.
        super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
        value.m_view.second = 0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        .values.base.
        super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_false>.value.
        m_view.first = (char *)0x0;
        auStack_208 = (undefined1  [8])0x0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        .values.base.
        super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
        value.m_view.first = (char *)0x0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        ._32_8_ = 0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
        .unparsed.
        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
        .
        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
        .super_SmallVectorBase.BeginX =
             (void *)groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                     .allBits.super__Base_bitset<1UL>._M_w;
LAB_00a6f6aa:
        while( true ) {
          groupSet.bits.super__Base_bitset<7UL>._M_w[6] = (_WordT)cursor;
          bVar3 = match_int_fast((int *)&local_34,cursor);
          if (!bVar3) {
            bVar3 = StreamCursor::eof(cursor);
            cVar4 = '?';
            if (!bVar3) {
              cVar4 = StreamCursor::current(cursor);
            }
            ParsingContext::setError
                      (context,ParsingError,
                       "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0x180,
                       (ulong)(uint)(int)cVar4);
            goto LAB_00a6f9c8;
          }
          iVar5 = details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  ::of_binary_search(local_34);
          if (iVar5 == -1) break;
          bVar3 = std::bitset<386UL>::test((bitset<386UL> *)auStack_c8,(ulong)local_34);
          if (bVar3) goto LAB_00a6f841;
          bVar3 = StreamCursor::advance(cursor,1);
          if (!bVar3) {
            pcVar7 = "Expected value after Tag %d, got EOF";
            goto LAB_00a6f95d;
          }
          TagSet<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::set
                    ((TagSet<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      *)auStack_c8,local_34);
          local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
          visitor.context = (ParsingContext *)auStack_c8;
          visitor._0_8_ = context;
          visitor.groupSet._0_1_ = strict;
          visitor.groupSet._1_1_ = skipUnknown;
          doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>::Visitor,0ul,1ul>
                    (auStack_208,local_34,local_68);
          if ((local_68[0] == '\0') && (bVar3 = StreamCursor::advance(cursor,1), !bVar3)) {
            ParsingContext::setError(context,Incomplete,"Got early EOF in RepeatingGroup %d",0x180);
            goto LAB_00a6f9c8;
          }
          StreamCursor::Revert::~Revert((Revert *)(groupSet.bits.super__Base_bitset<7UL>._M_w + 6));
        }
        iVar6 = details::
                IndexesImpl<meta::pack::Pack<Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>_>
                ::of_binary_search(local_34);
        if ((iVar6 != -1) || (local_34 == 10)) goto LAB_00a6f841;
        bVar3 = StreamCursor::advance(cursor,1);
        if (!bVar3) {
          pcVar7 = "Expected value after tag %d, got EOF";
LAB_00a6f95d:
          ParsingContext::setError(context,Incomplete,pcVar7,(ulong)local_34);
LAB_00a6f9c8:
          StreamCursor::Revert::~Revert((Revert *)(groupSet.bits.super__Base_bitset<7UL>._M_w + 6));
          llvm::
          SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
          ::~SmallVectorImpl((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                              *)&groupRef.
                                 super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                 .allBits);
          return;
        }
        lVar1 = *(long *)&cursor->buf->field_0x8;
        pcVar7 = *(char **)&cursor->buf->field_0x10;
        bVar3 = match_until_fast('|',cursor);
        if (bVar3) {
          if (strict) {
            ParsingContext::setError
                      (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",
                       (ulong)local_34,0x180);
            goto LAB_00a6f9c8;
          }
          if (!skipUnknown) {
            visitor._0_8_ =
                 (lVar1 + *(long *)&cursor->buf->field_0x10) -
                 (long)(pcVar7 + *(long *)&cursor->buf->field_0x8);
            local_68 = (undefined1  [8])pcVar7;
            llvm::
            SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>::Unparsed>
            ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
                      ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>::Unparsed>
                        *)&groupRef.
                           super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                           .allBits,(int *)&local_34,(pair<const_char_*,_unsigned_long> *)local_68);
          }
          bVar3 = StreamCursor::advance(cursor,1);
          if (bVar3) {
            StreamCursor::Revert::~Revert
                      ((Revert *)(groupSet.bits.super__Base_bitset<7UL>._M_w + 6));
            goto LAB_00a6f6aa;
          }
          type = Incomplete;
          pcVar7 = "Got early EOF after tag %d value";
        }
        else {
          pcVar7 = "Expected value after tag %d, got EOF";
          type = ParsingError;
        }
        ParsingContext::setError(context,type,pcVar7,(ulong)local_34);
        goto LAB_00a6f9c8;
      }
      pcVar7 = "Expected RepeatingGroup %d, got EOF";
    }
    ParsingContext::setError(context,Incomplete,pcVar7,0x180);
  }
  else {
    bVar3 = StreamCursor::eof(cursor);
    if (bVar3) {
      uVar8 = 0x3f;
    }
    else {
      cVar4 = StreamCursor::current(cursor);
      uVar8 = (ulong)(uint)(int)cVar4;
    }
    ParsingContext::setError
              (context,ParsingError,
               "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",
               0x180,uVar8);
  }
  return;
LAB_00a6f841:
  StreamCursor::Revert::~Revert((Revert *)(groupSet.bits.super__Base_bitset<7UL>._M_w + 6));
  llvm::
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
               *)visitor._24_8_,
              (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               *)auStack_208);
  groupSet.bits.super__Base_bitset<7UL>._M_w[3] = 0;
  groupSet.bits.super__Base_bitset<7UL>._M_w[4] = 0;
  groupSet.bits.super__Base_bitset<7UL>._M_w[1] = 0;
  groupSet.bits.super__Base_bitset<7UL>._M_w[2] = 0;
  auStack_c8 = (undefined1  [8])0x0;
  groupSet.bits.super__Base_bitset<7UL>._M_w[0] = 0;
  groupSet.bits.super__Base_bitset<7UL>._M_w[5] = 0;
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
  ::~SmallVectorImpl((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                      *)&groupRef.
                         super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                         .allBits);
  if (iVar5 == -1) {
    return;
  }
  goto LAB_00a6f67f;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }